

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O3

location_type_t parse_location_type(char *value)

{
  byte bVar1;
  
  bVar1 = *value;
  if (bVar1 < 0x31) {
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
    if (bVar1 == 0x30) {
      return (uint)(value[1] != '\0') * 3;
    }
  }
  else {
    if (bVar1 == 0x31) {
      return (uint)(value[1] != '\0') * 2 + LT_STATION;
    }
    if (bVar1 == 0x32) {
      return LT_NOT_SET - (value[1] == '\0');
    }
  }
  return LT_NOT_SET;
}

Assistant:

location_type_t parse_location_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return LT_STOP;
    else if (strcmp(value, "1") == 0)
        return LT_STATION;
    else if (strcmp(value, "2") == 0)
        return LT_STATION_ENTRANCE_EXIT;
    else
        return LT_NOT_SET;
}